

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O3

void soplex::
     SPxShellsort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
               (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *keys,int end,IdxCompare *compare,int start)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int a;
  int iVar4;
  undefined8 uVar5;
  int iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  int32_t iVar14;
  fpclass_type fVar15;
  int32_t iVar16;
  bool bVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar21;
  int iVar22;
  long lVar23;
  bool bVar24;
  
  lVar18 = 2;
  do {
    iVar2 = SPxShellsort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxCompare>
            ::incs[lVar18];
    lVar19 = (long)start + (long)iVar2;
    lVar23 = lVar19;
    iVar22 = start;
    if ((int)lVar19 <= end) {
      do {
        uVar5 = *(undefined8 *)(keys[lVar23].val.m_backend.data._M_elems + 8);
        uVar7 = *(undefined8 *)keys[lVar23].val.m_backend.data._M_elems;
        uVar8 = *(undefined8 *)(keys[lVar23].val.m_backend.data._M_elems + 2);
        puVar1 = keys[lVar23].val.m_backend.data._M_elems + 4;
        uVar9 = *(undefined8 *)puVar1;
        uVar10 = *(undefined8 *)(puVar1 + 2);
        iVar3 = keys[lVar23].val.m_backend.exp;
        bVar24 = keys[lVar23].val.m_backend.neg;
        fVar15 = keys[lVar23].val.m_backend.fpclass;
        iVar16 = keys[lVar23].val.m_backend.prec_elem;
        a = keys[lVar23].idx;
        iVar20 = (int)lVar23;
        iVar6 = iVar22;
        if (lVar19 <= lVar23) {
          do {
            bVar17 = EQ(a,keys[iVar6].idx);
            iVar20 = iVar6;
            if ((bVar17) || (iVar4 = keys[iVar6].idx, iVar4 <= a)) break;
            iVar20 = iVar2 + iVar6;
            pNVar21 = keys + iVar6;
            *(undefined8 *)(keys[iVar20].val.m_backend.data._M_elems + 8) =
                 *(undefined8 *)((pNVar21->val).m_backend.data._M_elems + 8);
            uVar11 = *(undefined8 *)(pNVar21->val).m_backend.data._M_elems;
            uVar12 = *(undefined8 *)((pNVar21->val).m_backend.data._M_elems + 2);
            uVar13 = *(undefined8 *)((pNVar21->val).m_backend.data._M_elems + 6);
            puVar1 = keys[iVar20].val.m_backend.data._M_elems + 4;
            *(undefined8 *)puVar1 = *(undefined8 *)((pNVar21->val).m_backend.data._M_elems + 4);
            *(undefined8 *)(puVar1 + 2) = uVar13;
            *(undefined8 *)keys[iVar20].val.m_backend.data._M_elems = uVar11;
            *(undefined8 *)(keys[iVar20].val.m_backend.data._M_elems + 2) = uVar12;
            keys[iVar20].val.m_backend.exp = (pNVar21->val).m_backend.exp;
            keys[iVar20].val.m_backend.neg = (pNVar21->val).m_backend.neg;
            iVar14 = (pNVar21->val).m_backend.prec_elem;
            keys[iVar20].val.m_backend.fpclass = (pNVar21->val).m_backend.fpclass;
            keys[iVar20].val.m_backend.prec_elem = iVar14;
            keys[iVar20].idx = iVar4;
            iVar20 = iVar6 - iVar2;
            bVar17 = (int)lVar19 <= iVar6;
            iVar6 = iVar20;
          } while (bVar17);
          iVar20 = iVar20 + iVar2;
        }
        *(undefined8 *)(keys[iVar20].val.m_backend.data._M_elems + 8) = uVar5;
        puVar1 = keys[iVar20].val.m_backend.data._M_elems + 4;
        *(undefined8 *)puVar1 = uVar9;
        *(undefined8 *)(puVar1 + 2) = uVar10;
        *(undefined8 *)keys[iVar20].val.m_backend.data._M_elems = uVar7;
        *(undefined8 *)(keys[iVar20].val.m_backend.data._M_elems + 2) = uVar8;
        keys[iVar20].val.m_backend.exp = iVar3;
        keys[iVar20].val.m_backend.neg = bVar24;
        keys[iVar20].val.m_backend.fpclass = fVar15;
        keys[iVar20].val.m_backend.prec_elem = iVar16;
        keys[iVar20].idx = a;
        lVar23 = lVar23 + 1;
        iVar22 = iVar22 + 1;
      } while (end + 1 != (int)lVar23);
    }
    bVar24 = lVar18 == 0;
    lVar18 = lVar18 + -1;
    if (bVar24) {
      return;
    }
  } while( true );
}

Assistant:

void SPxShellsort(T* keys, int end, COMPARATOR& compare, int start = 0)
{
   static const int incs[3] = {1, 5, 19}; /* sequence of increments */
   int k;

   assert(start <= end);

   for(k = 2; k >= 0; --k)
   {
      int h = incs[k];
      int first = h + start;
      int i;

      for(i = first; i <= end; ++i)
      {
         int j;
         T tempkey = keys[i];

         j = i;

         while(j >= first && compare(tempkey, keys[j - h]) < 0)
         {
            keys[j] = keys[j - h];
            j -= h;
         }

         keys[j] = tempkey;
      }
   }
}